

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::TransformationParameter::Clear(TransformationParameter *this)

{
  string *psVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  (this->mean_value_).current_size_ = 0;
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    if ((this->mean_file_).ptr_ ==
        (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0x4653);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_50,
                         "CHECK failed: !mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                        );
      google::protobuf::internal::LogFinisher::operator=(&local_51,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_50);
    }
    psVar1 = (this->mean_file_).ptr_;
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  if (((this->_has_bits_).has_bits_[0] & 0x3e) != 0) {
    *(undefined4 *)((long)&this->crop_size_ + 3) = 0;
    this->crop_size_ = 0;
    this->scale_ = 1.0;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void TransformationParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.TransformationParameter)
  mean_value_.Clear();
  if (has_mean_file()) {
    GOOGLE_DCHECK(!mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
    (*mean_file_.UnsafeRawStringPointer())->clear();
  }
  if (_has_bits_[0 / 32] & 62u) {
    ::memset(&crop_size_, 0, reinterpret_cast<char*>(&force_gray_) -
      reinterpret_cast<char*>(&crop_size_) + sizeof(force_gray_));
    scale_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}